

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall MessageThread::MessageThread(MessageThread *this,int q,MessageQueue *mq)

{
  __shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  Thread::Thread(&this->super_Thread);
  (this->super_enable_shared_from_this<MessageThread>)._M_weak_this.
  super___weak_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<MessageThread>)._M_weak_this.
  super___weak_ptr<MessageThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__MessageThread_001b5458;
  this->queueId = q;
  this->queue = mq;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  EventLoop::eventLoop();
  std::__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<EventLoop,void>
            ((__weak_ptr<EventLoop,(__gnu_cxx::_Lock_policy)2> *)&this->loop,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return;
}

Assistant:

MessageThread(int q, MessageQueue* mq)
        : queueId(q), queue(mq), stopped(false), loop(EventLoop::eventLoop())
    {
    }